

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O0

void helper_vpermr_ppc(CPUPPCState_conflict *env,ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b,ppc_avr_t *c
                      )

{
  int iVar1;
  int index;
  int s;
  int i;
  ppc_avr_t result;
  ppc_avr_t *c_local;
  ppc_avr_t *b_local;
  ppc_avr_t *a_local;
  ppc_avr_t *r_local;
  CPUPPCState_conflict *env_local;
  
  for (index = 0; (uint)index < 0x10; index = index + 1) {
    iVar1 = 0xf - (c->u8[0xf - index] & 0xf);
    if ((c->u8[0xf - index] & 0x10) == 0) {
      *(uint8_t *)((long)&s + (long)(0xf - index)) = b->u8[0xf - iVar1];
    }
    else {
      *(uint8_t *)((long)&s + (long)(0xf - index)) = a->u8[0xf - iVar1];
    }
  }
  r->u64[0] = _s;
  r->u64[1] = result.u64[0];
  return;
}

Assistant:

void helper_vpermr(CPUPPCState *env, ppc_avr_t *r, ppc_avr_t *a, ppc_avr_t *b,
                  ppc_avr_t *c)
{
    ppc_avr_t result;
    int i;

    for (i = 0; i < ARRAY_SIZE(r->u8); i++) {
        int s = c->VsrB(i) & 0x1f;
        int index = 15 - (s & 0xf);

        if (s & 0x10) {
            result.VsrB(i) = a->VsrB(index);
        } else {
            result.VsrB(i) = b->VsrB(index);
        }
    }
    *r = result;
}